

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

StructUnionTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StructUnionTypeSyntax,slang::syntax::StructUnionTypeSyntax_const&>
          (BumpAllocator *this,StructUnionTypeSyntax *args)

{
  StructUnionTypeSyntax *this_00;
  
  this_00 = (StructUnionTypeSyntax *)allocate(this,0xe8,8);
  slang::syntax::StructUnionTypeSyntax::StructUnionTypeSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }